

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  bool bVar1;
  cmDynamicLoaderCache *pcVar2;
  LibraryHandle p;
  allocator local_39;
  LibraryHandle local_38;
  string local_30;
  
  pcVar2 = cmDynamicLoaderCache::GetInstance();
  bVar1 = cmDynamicLoaderCache::GetCacheFile(pcVar2,libname,&local_38);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_30,libname,&local_39);
    p = cmsys::DynamicLoader::OpenLibrary(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pcVar2 = cmDynamicLoaderCache::GetInstance();
    cmDynamicLoaderCache::CacheFile(pcVar2,libname,p);
    local_38 = p;
  }
  return local_38;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname)
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if (cmDynamicLoaderCache::GetInstance()->GetCacheFile(libname, lh)) {
    return lh;
  }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance()->CacheFile(libname, lh);
  return lh;
}